

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitstream.c
# Opt level: O0

int vs_mark(bitstream *str,uint32_t val,int size)

{
  int iVar1;
  uint local_24;
  int local_20;
  uint32_t tmp;
  int size_local;
  uint32_t val_local;
  bitstream *str_local;
  
  local_24 = val;
  local_20 = size;
  tmp = val;
  _size_local = str;
  iVar1 = vs_u(str,&local_24,size);
  if (iVar1 == 0) {
    if (local_24 == tmp) {
      str_local._4_4_ = 0;
    }
    else {
      fprintf(_stderr,"Marker value invalid: %d vs %d\n",(ulong)local_24,(ulong)tmp);
      str_local._4_4_ = 1;
    }
  }
  else {
    str_local._4_4_ = 1;
  }
  return str_local._4_4_;
}

Assistant:

int vs_mark(struct bitstream *str, uint32_t val, int size) {
	uint32_t tmp = val;
	if (vs_u(str, &tmp, size)) return 1;
	if (tmp != val) {
		fprintf(stderr, "Marker value invalid: %d vs %d\n", tmp, val);
		return 1;
	}
	return 0;
}